

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseStartModuleField(WastParser *this,Module *module)

{
  Result RVar1;
  Enum EVar2;
  long *local_b8;
  Location loc;
  Var var;
  Location local_48;
  
  RVar1 = Expect(this,Lpar);
  if (RVar1.enum_ != Error) {
    GetLocation(&loc,this);
    if ((module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      RVar1 = Expect(this,Start);
      if (RVar1.enum_ != Error) {
        local_48.field_1.field_0.line = 0;
        local_48.field_1._4_8_ = 0;
        local_48.filename.data_ = (char *)0x0;
        local_48.filename.size_._0_4_ = 0;
        local_48.filename.size_._4_4_ = 0;
        Var::Var(&var,0xffffffff,&local_48);
        RVar1 = ParseVar(this,&var);
        EVar2 = Error;
        if ((RVar1.enum_ != Error) && (RVar1 = Expect(this,Rpar), RVar1.enum_ != Error)) {
          MakeUnique<wabt::StartModuleField,wabt::Var&,wabt::Location&>((wabt *)&local_b8,&var,&loc)
          ;
          Module::AppendField(module,(unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
                                      *)&local_b8);
          if (local_b8 != (long *)0x0) {
            (**(code **)(*local_b8 + 8))();
          }
          local_b8 = (long *)0x0;
          EVar2 = Ok;
        }
        Var::~Var(&var);
        return (Result)EVar2;
      }
    }
    else {
      Error(this,0x1962aa);
    }
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseStartModuleField(Module* module) {
  WABT_TRACE(ParseStartModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  if (module->starts.size() > 0) {
    Error(loc, "multiple start sections");
    return Result::Error;
  }
  EXPECT(Start);
  Var var;
  CHECK_RESULT(ParseVar(&var));
  EXPECT(Rpar);
  module->AppendField(MakeUnique<StartModuleField>(var, loc));
  return Result::Ok;
}